

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++.cc
# Opt level: O1

Status __thiscall
osqp::anon_unknown_6::UpdateUpperTriangularObjectiveMatrix
          (anon_unknown_6 *this,SparseMatrix<double,_0,_long_long> *objective_matrix_upper_triangle,
          OSQPWorkspaceHelper *workspace)

{
  OSQPData *pOVar1;
  long *plVar2;
  long lVar3;
  c_int cVar4;
  long P_new_n;
  Status *result;
  long lVar5;
  size_type in_R9;
  UntypedFormatSpecImpl format;
  string_view message;
  string_view message_00;
  Span<const_absl::str_format_internal::FormatArgImpl> args;
  string local_68;
  size_t local_48;
  code *local_40;
  size_t local_38;
  code *local_30;
  size_t local_28;
  code *local_20;
  
  pOVar1 = (workspace->super_OSQPWorkspace).data;
  local_28 = pOVar1->n;
  local_38 = objective_matrix_upper_triangle->m_outerSize;
  local_48 = objective_matrix_upper_triangle->m_innerSize;
  if (local_28 == local_48 && local_48 == local_38) {
    VerifySameSparsity(this,objective_matrix_upper_triangle,pOVar1->P,local_28);
    if (*(long *)this == 1) {
      plVar2 = objective_matrix_upper_triangle->m_innerNonZeros;
      if (plVar2 == (long *)0x0) {
        P_new_n = objective_matrix_upper_triangle->m_outerIndex
                  [objective_matrix_upper_triangle->m_outerSize] -
                  *objective_matrix_upper_triangle->m_outerIndex;
      }
      else {
        lVar3 = objective_matrix_upper_triangle->m_outerSize;
        if (lVar3 == 0) {
          P_new_n = 0;
        }
        else {
          if (lVar3 < 0) {
            __assert_fail("vecSize >= 0","/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xa6,
                          "Eigen::MapBase<Eigen::Map<const Eigen::Matrix<long long, -1, 1>>>::MapBase(PointerType, Index) [Derived = Eigen::Map<const Eigen::Matrix<long long, -1, 1>>, Level = 0]"
                         );
          }
          P_new_n = *plVar2;
          if (lVar3 != 1) {
            lVar5 = 1;
            do {
              P_new_n = P_new_n + plVar2[lVar5];
              lVar5 = lVar5 + 1;
            } while (lVar3 != lVar5);
          }
        }
      }
      cVar4 = osqp_update_P(&workspace->super_OSQPWorkspace,
                            (objective_matrix_upper_triangle->m_data).m_values,(c_int *)0x0,P_new_n)
      ;
      if ((int)cVar4 == 0) {
        *(undefined8 *)this = 1;
      }
      else {
        message_00._M_str = (char *)0x38;
        message_00._M_len = (size_t)this;
        absl::UnknownError(message_00);
      }
    }
  }
  else {
    local_40 = absl::str_format_internal::FormatArgImpl::Dispatch<long>;
    local_30 = absl::str_format_internal::FormatArgImpl::Dispatch<long>;
    local_20 = absl::str_format_internal::FormatArgImpl::Dispatch<long_long>;
    format.size_ = (size_t)&local_48;
    format.data_ = (void *)0x87;
    args.len_ = in_R9;
    args.ptr_ = (pointer)0x3;
    absl::str_format_internal::FormatPack_abi_cxx11_
              (&local_68,
               (str_format_internal *)
               "The new objective matrix should be square with dimension equal to the number of variables. Matrix dimensions: %d x %d, num_variables=%d"
               ,format,args);
    message._M_str = (char *)local_68._M_string_length;
    message._M_len = (size_t)this;
    absl::InvalidArgumentError(message);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status UpdateUpperTriangularObjectiveMatrix(
    const Eigen::SparseMatrix<double, Eigen::ColMajor, c_int>&
        objective_matrix_upper_triangle,
    OSQPWorkspaceHelper* workspace) {
  const c_int num_variables = workspace->data->n;

  if (objective_matrix_upper_triangle.rows() !=
          objective_matrix_upper_triangle.cols() ||
      objective_matrix_upper_triangle.rows() != num_variables) {
    return absl::InvalidArgumentError(absl::StrFormat(
        "The new objective matrix should be square with dimension equal to the "
        "number of variables. Matrix dimensions: %d x %d, num_variables=%d",
        objective_matrix_upper_triangle.rows(),
        objective_matrix_upper_triangle.cols(), num_variables));
  }

  OSQP_RETURN_IF_ERROR(VerifySameSparsity(objective_matrix_upper_triangle,
                                          workspace->data->P, num_variables));

  c_int nnzP = objective_matrix_upper_triangle.nonZeros();

  const int return_code = osqp_update_P(
      workspace, objective_matrix_upper_triangle.valuePtr(), OSQP_NULL, nnzP);
  if (return_code == 0) {
    return absl::OkStatus();
  }
  return absl::UnknownError(
      "Unable to update OSQP P matrix: unrecognized error code.");
}